

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_details.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_details::load(xr_level_details *this,xr_reader *r)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32_t uVar3;
  size_t sVar4;
  xr_dm *this_00;
  ulong uVar5;
  detail_slot_v3 *pdVar6;
  bool bVar7;
  ulong local_48;
  size_t size;
  xr_dm *local_30;
  xr_dm *dm;
  xr_reader *pxStack_20;
  uint32_t id;
  xr_reader *s;
  xr_reader *r_local;
  xr_level_details *this_local;
  
  s = r;
  r_local = (xr_reader *)this;
  sVar4 = xr_reader::find_chunk(r,0);
  if (sVar4 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                  ,0x3a,"void xray_re::xr_level_details::load(xr_reader &)");
  }
  details_header::load(&this->m_header,s);
  xr_reader::debug_find_chunk(s);
  bVar7 = true;
  if ((this->m_header).version != 2) {
    bVar7 = (this->m_header).version == 3;
  }
  if (!bVar7) {
    __assert_fail("m_header.version == DETAILS_VERSION_2 || m_header.version == DETAILS_VERSION_3",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                  ,0x3d,"void xray_re::xr_level_details::load(xr_reader &)");
  }
  if ((this->m_header).object_count != 0) {
    std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>::reserve
              (&this->m_models,(ulong)(this->m_header).object_count);
    pxStack_20 = xr_reader::open_chunk(s,1);
    if (pxStack_20 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                    ,0x44,"void xray_re::xr_level_details::load(xr_reader &)");
    }
    dm._4_4_ = 0;
    while (sVar4 = xr_reader::find_chunk(pxStack_20,dm._4_4_), sVar4 != 0) {
      this_00 = (xr_dm *)operator_new(0x250);
      memset(this_00,0,0x250);
      xr_level_dm::xr_level_dm((xr_level_dm *)this_00);
      local_30 = this_00;
      xr_dm::load_dm(this_00,pxStack_20);
      std::vector<xray_re::xr_dm_*,_std::allocator<xray_re::xr_dm_*>_>::push_back
                (&this->m_models,&local_30);
      dm._4_4_ = dm._4_4_ + 1;
    }
    xr_reader::close_chunk(s,&stack0xffffffffffffffe0);
    sVar4 = xr_reader::find_chunk(s,2);
    if ((this->m_header).version == 2) {
      if (sVar4 == 0 || sVar4 % 0x16 != 0) {
        __assert_fail("size && (size % sizeof(detail_slot_v2) == 0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                      ,0x4e,"void xray_re::xr_level_details::load(xr_reader &)");
      }
      local_48 = sVar4 / 0x16;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_48;
      uVar5 = SUB168(auVar1 * ZEXT816(0x10),0);
      if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pdVar6 = (detail_slot_v3 *)operator_new__(uVar5);
      this->m_slots = pdVar6;
      xr_reader::r_cseq<xray_re::detail_slot_v3,read_slot_v2>(s,local_48,this->m_slots);
    }
    else {
      if ((this->m_header).version != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                      ,0x56,"void xray_re::xr_level_details::load(xr_reader &)");
      }
      if (sVar4 == 0 || (sVar4 & 0xf) != 0) {
        __assert_fail("size && (size % sizeof(detail_slot_v3) == 0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                      ,0x52,"void xray_re::xr_level_details::load(xr_reader &)");
      }
      local_48 = sVar4 >> 4;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_48;
      uVar5 = SUB168(auVar2 * ZEXT816(0x10),0);
      if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pdVar6 = (detail_slot_v3 *)operator_new__(uVar5);
      this->m_slots = pdVar6;
      xr_reader::r_cseq<xray_re::detail_slot_v3>(s,local_48,this->m_slots);
    }
    uVar3 = num_slots(this);
    if (local_48 != uVar3) {
      __assert_fail("size == num_slots()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_details.cxx"
                    ,0x58,"void xray_re::xr_level_details::load(xr_reader &)");
    }
  }
  return;
}

Assistant:

void xr_level_details::load(xr_reader& r)
{
	if (!r.find_chunk(FSD_HEADER))
		xr_not_expected();
	m_header.load(r);
	r.debug_find_chunk();
	xr_assert(m_header.version == DETAILS_VERSION_2 || m_header.version == DETAILS_VERSION_3);

	if (m_header.object_count == 0)
		return;

	m_models.reserve(m_header.object_count);
	xr_reader* s = r.open_chunk(FSD_MESHES);
	xr_assert(s);
	for (uint32_t id = 0; s->find_chunk(id); ++id) {
		xr_dm* dm = new xr_level_dm();
		dm->load_dm(*s);
		m_models.push_back(dm);
	}
	r.close_chunk(s);

	size_t size = r.find_chunk(FSD_SLOTS);
	if (m_header.version == DETAILS_VERSION_2) {
		xr_assert(size && (size % sizeof(detail_slot_v2) == 0));
		m_slots = new detail_slot_v3[size /= sizeof(detail_slot_v2)];
		r.r_cseq(size, m_slots, read_slot_v2());
	} else if (m_header.version == DETAILS_VERSION_3) {
		xr_assert(size && (size % sizeof(detail_slot_v3) == 0));
		m_slots = new detail_slot_v3[size /= sizeof(detail_slot_v3)];
		r.r_cseq(size, m_slots);
	} else {
		xr_not_expected();
	}
	xr_assert(size == num_slots());
}